

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

Index __thiscall
wabt::interp::FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>
          (FreeList<wabt::interp::Ref> *this,Ref *args)

{
  pointer puVar1;
  _Bit_type *p_Var2;
  ulong uVar3;
  iterator __position;
  Ref *pRVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  puVar1 = (this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == puVar1) {
    if ((long)(this->list_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->list_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 !=
        (ulong)(this->is_free_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(this->is_free_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
        (long)(this->is_free_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
      __assert_fail("list_.size() == is_free_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x98,
                    "Index wabt::interp::FreeList<wabt::interp::Ref>::New(Args &&...) [T = wabt::interp::Ref, Args = <wabt::interp::Ref &>]"
                   );
    }
    std::vector<bool,_std::allocator<bool>_>::push_back(&this->is_free_,false);
    __position._M_current =
         (this->list_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->list_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
      _M_realloc_insert<wabt::interp::Ref&>
                ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)this,__position,args
                );
      pRVar4 = (this->list_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      (__position._M_current)->index = args->index;
      pRVar4 = __position._M_current + 1;
      (this->list_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
      _M_impl.super__Vector_impl_data._M_finish = pRVar4;
    }
    uVar5 = ((long)pRVar4 -
             (long)(this->list_).
                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3) - 1;
  }
  else {
    uVar5 = puVar1[-1];
    uVar6 = uVar5 + 0x3f;
    if (-1 < (long)uVar5) {
      uVar6 = uVar5;
    }
    p_Var2 = (this->is_free_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar7 = (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001);
    uVar3 = p_Var2[((long)uVar6 >> 6) + uVar7 + 0xffffffffffffffff];
    if ((uVar3 >> (uVar5 & 0x3f) & 1) == 0) {
      __assert_fail("is_free_[index]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x92,
                    "Index wabt::interp::FreeList<wabt::interp::Ref>::New(Args &&...) [T = wabt::interp::Ref, Args = <wabt::interp::Ref &>]"
                   );
    }
    (this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1 + -1;
    p_Var2[((long)uVar6 >> 6) + uVar7 + 0xffffffffffffffff] = uVar3 & ~(1L << ((byte)uVar5 & 0x3f));
    (this->list_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start[uVar5].index = args->index;
  }
  return uVar5;
}

Assistant:

auto FreeList<T>::New(Args&&... args) -> Index {
  if (!free_.empty()) {
    Index index = free_.back();
    assert(is_free_[index]);
    free_.pop_back();
    is_free_[index] = false;
    list_[index] = T(std::forward<Args>(args)...);
    return index;
  }
  assert(list_.size() == is_free_.size());
  is_free_.push_back(false);
  list_.emplace_back(std::forward<Args>(args)...);
  return list_.size() - 1;
}